

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O2

Gia_Man_t * Gia_ManDupToBarBufs(Gia_Man_t *p,int nBarBufs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  if (p->nBufs != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x138,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x139,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p->pSibls == (int *)0x0) {
    __assert_fail("Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x13a,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  iVar1 = p->vCis->nSize - nBarBufs;
  iVar8 = p->vCos->nSize;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  if (p->pSibls != (int *)0x0) {
    piVar5 = (int *)calloc((long)p->nObjs,4);
    p_00->pSibls = piVar5;
  }
  iVar8 = iVar8 - nBarBufs;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar9 = 0;
  iVar10 = 0;
  if (0 < iVar1) {
    iVar10 = iVar1;
  }
  for (; iVar10 != iVar9; iVar9 = iVar9 + 1) {
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar6 = Gia_ManCi(p,iVar9);
    pGVar6->Value = uVar2;
  }
  iVar10 = 0;
  iVar9 = 0;
  while ((iVar10 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar10), pGVar6 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      while ((iVar9 < nBarBufs &&
             (pGVar7 = Gia_ManCo(p,iVar9),
             pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].Value != 0xffffffff))) {
        pGVar7 = Gia_ManCo(p,iVar9);
        iVar3 = Gia_ObjFanin0Copy(pGVar7);
        uVar2 = Gia_ManAppendBuf(p_00,iVar3);
        pGVar7 = Gia_ManCi(p,iVar1 + iVar9);
        pGVar7->Value = uVar2;
        iVar9 = iVar9 + 1;
      }
      iVar3 = Gia_ObjFanin0Copy(pGVar6);
      iLit1 = Gia_ObjFanin1Copy(pGVar6);
      uVar2 = Gia_ManAppendAnd(p_00,iVar3,iLit1);
      pGVar6->Value = uVar2;
      iVar3 = Gia_ObjId(p,pGVar6);
      if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar3] != 0)) {
        iVar3 = Gia_ObjId(p,pGVar6);
        pGVar7 = Gia_ManObj(p,p->pSibls[iVar3]);
        iVar3 = Abc_Lit2Var(pGVar7->Value);
        piVar5 = p_00->pSibls;
        uVar2 = Abc_Lit2Var(pGVar6->Value);
        piVar5[uVar2] = iVar3;
      }
    }
    iVar10 = iVar10 + 1;
  }
  for (; iVar9 < nBarBufs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCo(p,iVar9);
    Gia_ObjFanin0Copy(pGVar6);
    pGVar6 = Gia_ManCo(p,iVar9);
    iVar10 = Gia_ObjFanin0Copy(pGVar6);
    uVar2 = Gia_ManAppendBuf(p_00,iVar10);
    pGVar6 = Gia_ManCi(p,iVar1 + iVar9);
    pGVar6->Value = uVar2;
  }
  if (iVar9 == nBarBufs) {
    iVar10 = 0;
    iVar9 = 0;
    if (0 < iVar8) {
      iVar10 = iVar8;
      iVar9 = 0;
    }
    for (; iVar10 != iVar9; iVar9 = iVar9 + 1) {
      pGVar6 = Gia_ManCo(p,nBarBufs + iVar9);
      iVar3 = Gia_ObjFanin0Copy(pGVar6);
      Gia_ManAppendCo(p_00,iVar3);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
    if (p_00->nBufs != nBarBufs) {
      __assert_fail("Gia_ManBufNum(pNew) == nBarBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                    ,0x156,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
    }
    if (p_00->vCis->nSize != iVar1) {
      __assert_fail("Gia_ManCiNum(pNew) == nPiReal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                    ,0x157,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
    }
    if (p_00->vCos->nSize != iVar8) {
      __assert_fail("Gia_ManCoNum(pNew) == nPoReal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                    ,0x158,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
    }
    return p_00;
  }
  __assert_fail("k == nBarBufs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                ,0x152,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupToBarBufs( Gia_Man_t * p, int nBarBufs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int nPiReal = Gia_ManCiNum(p) - nBarBufs;
    int nPoReal = Gia_ManCoNum(p) - nBarBufs;
    int i, k = 0;
    assert( Gia_ManBufNum(p) == 0 );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManHasChoices(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPiReal; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        for ( ; k < nBarBufs; k++ )
            if ( ~Gia_ObjFanin0(Gia_ManCo(p, k))->Value )
                Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
            else
                break;
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
    }
    for ( ; k < nBarBufs; k++ )
        if ( ~Gia_ObjFanin0Copy(Gia_ManCo(p, k)) )
            Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
    assert( k == nBarBufs );
    for ( i = 0; i < nPoReal; i++ )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, nBarBufs+i)) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( Gia_ManBufNum(pNew) == nBarBufs );
    assert( Gia_ManCiNum(pNew) == nPiReal );
    assert( Gia_ManCoNum(pNew) == nPoReal );
    return pNew;
}